

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O3

void clsolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  singlecomplex *psVar1;
  float fVar2;
  ulong uVar3;
  singlecomplex *psVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar15;
  singlecomplex sVar14;
  float fVar16;
  float fVar17;
  singlecomplex sVar18;
  singlecomplex sVar19;
  singlecomplex sVar20;
  float fVar21;
  singlecomplex sVar22;
  singlecomplex sVar23;
  singlecomplex sVar24;
  singlecomplex sVar25;
  float fVar26;
  
  uVar3 = 0;
  if (3 < ncol) {
    lVar6 = (long)ldm;
    lVar7 = (long)(ldm * 4 + 4);
    psVar4 = rhs + 4;
    pfVar11 = &M[lVar6 + 4].i;
    pfVar8 = &M[lVar6 * 2 + 4].i;
    pfVar9 = &M[lVar6 * 3 + 4].i;
    uVar3 = 0;
    uVar10 = (ulong)(uint)ncol;
    do {
      uVar10 = uVar10 - 4;
      fVar12 = rhs[uVar3].i;
      fVar21 = -fVar12;
      fVar2 = rhs[uVar3].r;
      fVar13 = rhs[uVar3 + 1].r - (M[1].r * fVar2 + M[1].i * fVar21);
      fVar15 = rhs[uVar3 + 1].i - (M[1].r * fVar12 + M[1].i * fVar2);
      fVar26 = -fVar15;
      fVar16 = (rhs[uVar3 + 2].r - (M[2].r * fVar2 + M[2].i * fVar21)) -
               (M[lVar6 + 2].r * fVar13 + M[lVar6 + 2].i * fVar26);
      fVar17 = (rhs[uVar3 + 2].i - (M[2].r * fVar12 + M[2].i * fVar2)) -
               (M[lVar6 + 2].r * fVar15 + M[lVar6 + 2].i * fVar13);
      sVar18.r = ((rhs[uVar3 + 3].r - (M[3].r * fVar2 + M[3].i * fVar21)) -
                 (M[lVar6 + 3].r * fVar13 + M[lVar6 + 3].i * fVar26)) -
                 (M[lVar6 * 2 + 3].r * fVar16 + M[lVar6 * 2 + 3].i * -fVar17);
      sVar18.i = ((rhs[uVar3 + 3].i - (M[3].r * fVar12 + M[3].i * fVar2)) -
                 (M[lVar6 + 3].r * fVar15 + M[lVar6 + 3].i * fVar13)) -
                 (M[lVar6 * 2 + 3].r * fVar17 + M[lVar6 * 2 + 3].i * fVar16);
      psVar1 = rhs + uVar3 + 1;
      psVar1->r = fVar13;
      psVar1->i = fVar15;
      psVar1[1].r = fVar16;
      psVar1[1].i = fVar17;
      rhs[uVar3 + 3] = sVar18;
      uVar3 = uVar3 + 4;
      if (uVar3 < (uint)ncol) {
        uVar5 = 0;
        do {
          sVar22.r = psVar4[uVar5].r - (M[uVar5 + 4].r * fVar2 + M[uVar5 + 4].i * fVar21);
          sVar22.i = psVar4[uVar5].i - (M[uVar5 + 4].r * fVar12 + M[uVar5 + 4].i * fVar2);
          psVar4[uVar5] = sVar22;
          sVar23.r = sVar22.r - (pfVar11[uVar5 * 2 + -1] * fVar13 + pfVar11[uVar5 * 2] * fVar26);
          sVar23.i = sVar22.i - (pfVar11[uVar5 * 2 + -1] * fVar15 + pfVar11[uVar5 * 2] * fVar13);
          psVar4[uVar5] = sVar23;
          sVar24.r = sVar23.r - (pfVar8[uVar5 * 2 + -1] * fVar16 + pfVar8[uVar5 * 2] * -fVar17);
          sVar24.i = sVar23.i - (pfVar8[uVar5 * 2 + -1] * fVar17 + pfVar8[uVar5 * 2] * fVar16);
          psVar4[uVar5] = sVar24;
          sVar25.r = sVar24.r - (pfVar9[uVar5 * 2 + -1] * sVar18.r + pfVar9[uVar5 * 2] * -sVar18.i);
          sVar25.i = sVar24.i - (pfVar9[uVar5 * 2 + -1] * sVar18.i + pfVar9[uVar5 * 2] * sVar18.r);
          psVar4[uVar5] = sVar25;
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
      M = M + lVar7;
      psVar4 = psVar4 + 4;
      pfVar11 = pfVar11 + lVar7 * 2;
      pfVar8 = pfVar8 + lVar7 * 2;
      pfVar9 = pfVar9 + lVar7 * 2;
    } while (uVar3 < ncol - 3);
  }
  if ((int)(uint)uVar3 < ncol + -1) {
    uVar10 = uVar3 & 0xffffffff;
    fVar12 = rhs[uVar10].i;
    fVar2 = rhs[uVar10].r;
    sVar14.r = rhs[uVar10 | 1].r - (M[1].r * fVar2 + M[1].i * -fVar12);
    sVar14.i = rhs[uVar10 | 1].i - (M[1].r * fVar12 + M[1].i * fVar2);
    rhs[uVar10 + 1] = sVar14;
    if ((int)((uint)uVar3 | 2) < ncol) {
      lVar6 = 0;
      do {
        sVar19.r = rhs[uVar10 + lVar6 + 2].r - (M[lVar6 + 2].r * fVar2 + M[lVar6 + 2].i * -fVar12);
        sVar19.i = rhs[uVar10 + lVar6 + 2].i - (M[lVar6 + 2].r * fVar12 + M[lVar6 + 2].i * fVar2);
        rhs[uVar10 + lVar6 + 2] = sVar19;
        sVar20.r = sVar19.r -
                   (M[(long)ldm + lVar6 + 2].r * sVar14.r + M[(long)ldm + lVar6 + 2].i * -sVar14.i);
        sVar20.i = sVar19.i -
                   (M[(long)ldm + lVar6 + 2].r * sVar14.i + M[(long)ldm + lVar6 + 2].i * sVar14.r);
        rhs[uVar10 + lVar6 + 2] = sVar20;
        lVar6 = lVar6 + 1;
      } while (((uint)ncol - uVar10) + -2 != lVar6);
    }
  }
  return;
}

Assistant:

void clsolve ( int ldm, int ncol, singlecomplex *M, singlecomplex *rhs )
{
    int k;
    singlecomplex x0, x1, x2, x3, temp;
    singlecomplex *M0;
    singlecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	cc_mult(&temp, &x0, Mki0); Mki0++;
      	c_sub(&x1, &rhs[firstcol+1], &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x2, &rhs[firstcol+2], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x2, &x2, &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x3, &rhs[firstcol+3], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x3, &x3, &temp);
	cc_mult(&temp, &x2, Mki2); Mki2++;
	c_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x2, Mki2); Mki2++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x3, Mki3); Mki3++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}